

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

string * tinyusdz::to_string(string *__return_storage_ptr__,string *s)

{
  allocator local_59;
  string local_58;
  string local_38;
  
  escapeBackslash(&local_38,s,false);
  ::std::__cxx11::string::string((string *)&local_58,"\"",&local_59);
  quote(__return_storage_ptr__,&local_38,&local_58);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::string &s) {
  // TODO: Escape `"` character.

  // Escape backslash
  return quote(escapeBackslash(s));
}